

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Vec_Int_t * Mf_ManDeriveCnfs(Mf_Man_t *p,int *pnVars,int *pnClas,int *pnLits)

{
  word t;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  word *pwVar3;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCnfs;
  Vec_Int_t *vLits;
  int pCnf [512];
  int *pCut;
  int local_38;
  int nLits;
  int nCubes;
  int iFunc;
  int k;
  int i;
  int *pnLits_local;
  int *pnClas_local;
  int *pnVars_local;
  Mf_Man_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vCnfSizes);
  p_00 = Vec_IntStart(iVar1);
  iVar1 = Vec_IntSize(&p->vCnfSizes);
  p_01 = Vec_IntAlloc(iVar1 * 3);
  iVar1 = Vec_IntSize(&p->vCnfSizes);
  Vec_IntFill(p_01,iVar1,-1);
  if (8 < p->pPars->nLutSize) {
    __assert_fail("p->pPars->nLutSize <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x114,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
  }
  for (nLits = 0; nLits < 2; nLits = nLits + 1) {
    if (p->pPars->nLutSize < 7) {
      pwVar3 = Vec_MemReadEntry(p->vTtMem,nLits);
      local_38 = Abc_Tt6Cnf(*pwVar3,nLits,(int *)&vLits);
    }
    else {
      pwVar3 = Vec_MemReadEntry(p->vTtMem,nLits);
      local_38 = Abc_Tt8Cnf(pwVar3,nLits,(int *)&vLits);
    }
    iVar1 = Mf_ManCountLits((int *)&vLits,local_38,nLits);
    Vec_IntWriteEntry(p_00,nLits,iVar1);
    iVar1 = Vec_IntSize(p_01);
    Vec_IntWriteEntry(p_01,nLits,iVar1);
    Vec_IntPush(p_01,local_38);
    for (nCubes = 0; nCubes < local_38; nCubes = nCubes + 1) {
      Vec_IntPush(p_01,pCnf[(long)nCubes + -2]);
    }
  }
  iVar1 = Gia_ManCiNum(p->pGia);
  iVar2 = Gia_ManCoNum(p->pGia);
  *pnVars = iVar1 + 1 + iVar2;
  iVar1 = Gia_ManCoNum(p->pGia);
  *pnClas = iVar1 * 2 + 1;
  iVar1 = Gia_ManCoNum(p->pGia);
  *pnLits = iVar1 * 4 + 1;
  iFunc = 0;
  do {
    if (p->pGia->nObjs <= iFunc) {
      Vec_IntFree(p_00);
      return p_01;
    }
    pObj = Gia_ManObj(p->pGia,iFunc);
    iVar1 = Gia_ObjIsAnd(pObj);
    if ((iVar1 != 0) && (iVar1 = Mf_ObjMapRefNum(p,iFunc), iVar1 != 0)) {
      pCnf._2040_8_ = Mf_ObjCutBest(p,iFunc);
      iVar1 = Mf_CutFunc((int *)pCnf._2040_8_);
      iVar1 = Abc_Lit2Var(iVar1);
      iVar2 = Vec_IntEntry(p_01,iVar1);
      if (iVar2 == -1) {
        if (p->pPars->nLutSize < 7) {
          pwVar3 = Vec_MemReadEntry(p->vTtMem,iVar1);
          t = *pwVar3;
          iVar2 = Mf_CutSize((int *)pCnf._2040_8_);
          local_38 = Abc_Tt6Cnf(t,iVar2,(int *)&vLits);
        }
        else {
          pwVar3 = Vec_MemReadEntry(p->vTtMem,iVar1);
          iVar2 = Mf_CutSize((int *)pCnf._2040_8_);
          local_38 = Abc_Tt8Cnf(pwVar3,iVar2,(int *)&vLits);
        }
        iVar2 = Vec_IntEntry(&p->vCnfSizes,iVar1);
        if (local_38 != iVar2) {
          __assert_fail("nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                        ,0x134,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
        }
        iVar2 = Mf_CutSize((int *)pCnf._2040_8_);
        iVar2 = Mf_ManCountLits((int *)&vLits,local_38,iVar2);
        Vec_IntWriteEntry(p_00,iVar1,iVar2);
        iVar2 = Vec_IntSize(p_01);
        Vec_IntWriteEntry(p_01,iVar1,iVar2);
        Vec_IntPush(p_01,local_38);
        for (nCubes = 0; nCubes < local_38; nCubes = nCubes + 1) {
          Vec_IntPush(p_01,pCnf[(long)nCubes + -2]);
        }
      }
      *pnVars = *pnVars + 1;
      iVar2 = Vec_IntEntry(&p->vCnfSizes,iVar1);
      *pnClas = iVar2 + *pnClas;
      iVar1 = Vec_IntEntry(p_00,iVar1);
      *pnLits = iVar1 + *pnLits;
    }
    iFunc = iFunc + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Mf_ManDeriveCnfs( Mf_Man_t * p, int * pnVars, int * pnClas, int * pnLits )
{
    int i, k, iFunc, nCubes, nLits, * pCut, pCnf[512];
    Vec_Int_t * vLits = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Vec_Int_t * vCnfs = Vec_IntAlloc( 3 * Vec_IntSize(&p->vCnfSizes) );
    Vec_IntFill( vCnfs, Vec_IntSize(&p->vCnfSizes), -1 );
    assert( p->pPars->nLutSize <= 8 );
    // constant/buffer
    for ( iFunc = 0; iFunc < 2; iFunc++ )
    {
        if ( p->pPars->nLutSize <= 6 )
            nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        else
            nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        nLits = Mf_ManCountLits( pCnf, nCubes, iFunc );
        Vec_IntWriteEntry( vLits, iFunc, nLits );
        Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
        Vec_IntPush( vCnfs, nCubes );
        for ( k = 0; k < nCubes; k++ )
            Vec_IntPush( vCnfs, pCnf[k] );
    }
    // other functions
    *pnVars = 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
    *pnClas = 1 + 2 * Gia_ManCoNum(p->pGia);
    *pnLits = 1 + 4 * Gia_ManCoNum(p->pGia);
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        //Mf_CutPrintOne( pCut );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        if ( Vec_IntEntry(vCnfs, iFunc) == -1 )
        {
            if ( p->pPars->nLutSize <= 6 )
                nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            else
                nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            assert( nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc) );
            nLits = Mf_ManCountLits( pCnf, nCubes, Mf_CutSize(pCut) );
            // save CNF
            Vec_IntWriteEntry( vLits, iFunc, nLits );
            Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
            Vec_IntPush( vCnfs, nCubes );
            for ( k = 0; k < nCubes; k++ )
                Vec_IntPush( vCnfs, pCnf[k] );
        }
        *pnVars += 1;
        *pnClas += Vec_IntEntry(&p->vCnfSizes, iFunc);
        *pnLits += Vec_IntEntry(vLits, iFunc);
    }
    Vec_IntFree( vLits );
    return vCnfs;
}